

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

QString * __thiscall
QUrlQueryPrivate::recodeToUser
          (QUrlQueryPrivate *this,QString *input,ComponentFormattingOptions encoding)

{
  QStringView in;
  QStringView in_00;
  uint uVar1;
  bool bVar2;
  char16_t cVar3;
  qsizetype qVar4;
  undefined4 in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString output;
  QString output_1;
  ushort actions [4];
  undefined4 in_stack_ffffffffffffff08;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_ffffffffffffff0c;
  QString *in_stack_ffffffffffffff10;
  QString *in_stack_ffffffffffffff18;
  QString *str;
  QStringView *in_stack_ffffffffffffff20;
  QStringView *this_00;
  ushort *in_stack_ffffffffffffff30;
  undefined1 **tableModifications;
  QString *in_stack_ffffffffffffff38;
  QFlagsStorage<QUrl::ComponentFormattingOption> encoding_00;
  long lVar5;
  QString *pQVar6;
  QStringView local_68;
  QString *local_58;
  undefined4 local_4c;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4> local_1c;
  undefined4 local_14;
  undefined8 local_10;
  long local_8;
  
  encoding_00.i = (Int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RSI;
  pQVar6 = in_RDI;
  local_14 = in_ECX;
  bVar2 = idempotentRecodeToUser((ComponentFormattingOptions)in_stack_ffffffffffffff0c.i);
  if (bVar2) {
    QString::QString(in_stack_ffffffffffffff10,
                     (QString *)CONCAT44(in_stack_ffffffffffffff0c.i,in_stack_ffffffffffffff08));
  }
  else {
    local_1c.super_QFlagsStorage<QUrl::ComponentFormattingOption>.i =
         (QFlagsStorage<QUrl::ComponentFormattingOption>)
         QFlags<QUrl::ComponentFormattingOption>::operator&
                   ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_ffffffffffffff10,
                    in_stack_ffffffffffffff0c.i);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      str = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      cVar3 = QChar::unicode((QChar *)(in_RSI + 0x22));
      local_10 = (undefined1 *)(CONCAT62(local_10._2_6_,cVar3) | 0x200);
      cVar3 = QChar::unicode((QChar *)(in_RSI + 0x20));
      uVar1 = CONCAT22(cVar3,(undefined2)local_10);
      local_10 = (undefined1 *)(ulong)CONCAT24(0x223,uVar1 | 0x2000000);
      local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      this_00 = &local_68;
      local_58 = str;
      QString::QString((QString *)0x31722e);
      QStringView::QStringView<QString,_true>(this_00,str);
      in_00.m_data = (storage_type_conflict *)pQVar6;
      in_00.m_size = lVar5;
      qVar4 = qt_urlRecode(in_stack_ffffffffffffff38,in_00,(ComponentFormattingOptions)encoding_00.i
                           ,in_stack_ffffffffffffff30);
      if (qVar4 == 0) {
        QString::QString(in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c.i,in_stack_ffffffffffffff08))
        ;
      }
      else {
        QString::QString(in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c.i,in_stack_ffffffffffffff08))
        ;
      }
      QString::~QString((QString *)0x3172e4);
    }
    else {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      tableModifications = &local_38;
      QString::QString((QString *)0x3170d1);
      QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      local_4c = local_14;
      in.m_data = (storage_type_conflict *)pQVar6;
      in.m_size = lVar5;
      qVar4 = qt_urlRecode(in_stack_ffffffffffffff38,in,(ComponentFormattingOptions)encoding_00.i,
                           (ushort *)tableModifications);
      if (qVar4 == 0) {
        QString::QString(in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c.i,in_stack_ffffffffffffff08))
        ;
      }
      else {
        QString::QString(in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c.i,in_stack_ffffffffffffff08))
        ;
      }
      QString::~QString((QString *)0x31718d);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QString QUrlQueryPrivate::recodeToUser(const QString &input, QUrl::ComponentFormattingOptions encoding) const
{
    // our internal formats are stored in "PrettyDecoded" form
    // and there are no ambiguous characters
    if (idempotentRecodeToUser(encoding))
        return input;

    if (!(encoding & QUrl::EncodeDelimiters)) {
        QString output;
        if (qt_urlRecode(output, input,
                         encoding, nullptr))
            return output;
        return input;
    }

    // re-encode the "#" character and the query delimiter pair
    ushort actions[] = { encode(pairDelimiter.unicode()), encode(valueDelimiter.unicode()),
                         encode('#'), 0 };
    QString output;
    if (qt_urlRecode(output, input, encoding, actions))
        return output;
    return input;
}